

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

void __thiscall hta::Directory::Directory(Directory *this,json *config,bool use_mutex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_hta::storage::Directory_*,_false> _Var2;
  int iVar3;
  const_reference pvVar4;
  _Head_base<0UL,_hta::storage::Directory_*,_false> this_00;
  size_type sVar5;
  reference this_01;
  undefined7 in_register_00000011;
  char cVar6;
  pointer *__ptr;
  bool bVar7;
  pair<hta::Metric_&,_bool> pVar8;
  iteration_proxy_internal __begin2;
  bool ret;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  iteration_proxy_internal __end2;
  path local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  vector<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
  *local_100;
  key_type local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->directory_)._M_t.
  super___uniq_ptr_impl<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>._M_t
  .super__Tuple_impl<0UL,_hta::storage::Directory_*,_std::default_delete<hta::storage::Directory>_>.
  super__Head_base<0UL,_hta::storage::Directory_*,_false>._M_head_impl = (Directory *)0x0;
  (this->metrics_)._M_h._M_buckets = &(this->metrics_)._M_h._M_single_bucket;
  (this->metrics_)._M_h._M_bucket_count = 1;
  (this->metrics_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->metrics_)._M_h._M_element_count = 0;
  (this->metrics_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->metrics_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->metrics_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->prefixes_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prefixes_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prefixes_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = (int)CONCAT71(in_register_00000011,use_mutex) != 0;
  if (bVar7) {
    *(undefined8 *)
     ((long)&(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
             super__Optional_payload_base<std::mutex>._M_payload + 0x10) = 0;
    *(undefined8 *)
     ((long)&(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
             super__Optional_payload_base<std::mutex>._M_payload + 0x18) = 0;
    *(undefined8 *)
     &(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
      super__Optional_payload_base<std::mutex>._M_payload = 0;
    *(undefined8 *)
     ((long)&(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
             super__Optional_payload_base<std::mutex>._M_payload + 8) = 0;
    *(undefined8 *)
     ((long)&(this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
             super__Optional_payload_base<std::mutex>._M_payload + 0x20) = 0;
  }
  local_100 = (vector<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
               *)&this->prefixes_;
  (this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
  super__Optional_payload_base<std::mutex>._M_engaged = bVar7;
  paVar1 = &local_148._M_pathname.field_2;
  local_148._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"type","");
  pvVar4 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(config,&local_148._M_pathname);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_b8,pvVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_pathname._M_dataplus._M_p,
                    local_148._M_pathname.field_2._M_allocated_capacity + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_b8);
  if (iVar3 == 0) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)config,"path");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_98,pvVar4);
    this_00._M_head_impl = (Directory *)operator_new(0x30);
    std::filesystem::__cxx11::path::path(&local_148,&local_98,auto_format);
    storage::file::Directory::Directory((Directory *)this_00._M_head_impl,&local_148);
    Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_148);
    _Var2._M_head_impl =
         (this->directory_)._M_t.
         super___uniq_ptr_impl<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>
         ._M_t.
         super__Tuple_impl<0UL,_hta::storage::Directory_*,_std::default_delete<hta::storage::Directory>_>
         .super__Head_base<0UL,_hta::storage::Directory_*,_false>._M_head_impl;
    (this->directory_)._M_t.
    super___uniq_ptr_impl<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>.
    _M_t.
    super__Tuple_impl<0UL,_hta::storage::Directory_*,_std::default_delete<hta::storage::Directory>_>
    .super__Head_base<0UL,_hta::storage::Directory_*,_false>._M_head_impl = this_00._M_head_impl;
    if (_Var2._M_head_impl != (Directory *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_Directory[2])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (config->m_type == object) {
      sVar5 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
              ::_M_count_tr<char[8],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                          *)(config->m_value).object,(char (*) [8])"metrics");
    }
    else {
      sVar5 = 0;
    }
    if (sVar5 != 0) {
      local_148._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"metrics","");
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(config,&local_148._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_148._M_pathname._M_dataplus._M_p,
                        local_148._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if (pvVar4->m_type != object) {
        __assert_fail("metrics.is_object()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/directory.cpp"
                      ,0x65,"hta::Directory::Directory(const json &, bool)");
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::cbegin((const_iterator *)&local_148,pvVar4);
      local_148._32_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::cend((const_iterator *)&local_98,pvVar4);
      local_78 = 0;
      while( true ) {
        bVar7 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_148,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_98);
        if (bVar7) break;
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_internal::key(&local_d8,(iteration_proxy_internal *)&local_148);
        this_01 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_148);
        if (this_01->m_type == object) {
          sVar5 = std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                  ::_M_count_tr<char[7],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                              *)(this_01->m_value).object,(char (*) [7])"prefix");
        }
        else {
          sVar5 = 0;
        }
        if (sVar5 == 0) {
          cVar6 = '\0';
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"prefix","");
          pvVar4 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::at(this_01,&local_f8);
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (pvVar4,(boolean_t *)&local_120);
          cVar6 = (char)local_120._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        if (cVar6 == '\0') {
          pVar8 = emplace(this,&local_d8,this_01);
          if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_d8._M_dataplus._M_p,
                       local_d8._M_dataplus._M_p + local_d8._M_string_length);
            throw_exception<hta::Exception,char_const*,std::__cxx11::string>
                      ("duplicated metric name in initial configuration: ",&local_70);
          }
        }
        else {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_120,local_d8._M_dataplus._M_p,
                     local_d8._M_dataplus._M_p + local_d8._M_string_length);
          std::__cxx11::string::append((char *)&local_120);
          std::
          vector<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
          ::
          emplace_back<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&>
                    (local_100,&local_120,this_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&local_148);
        local_148._32_8_ = local_148._32_8_ + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_b8._M_dataplus._M_p,
             local_b8._M_dataplus._M_p + local_b8._M_string_length);
  throw_exception<hta::Exception,char_const*,std::__cxx11::string>
            ("Unknown directory type: ",&local_50);
}

Assistant:

Directory::Directory(const json& config, bool use_mutex) : mutex_(use_mutex)
{
    auto type = config.at("type").get<std::string>();
    if (type == "file")
    {
        directory_ = std::make_unique<storage::file::Directory>(config["path"].get<std::string>());
    }
    else
    {
        throw_exception("Unknown directory type: ", type);
    }

    if (config.count("metrics"))
    {
        auto& metrics = config.at("metrics");
        assert(metrics.is_object());
        for (const auto& elem : metrics.items())
        {
            std::string name = elem.key();
            const auto& metric_config = elem.value();
            if (metric_config.count("prefix") && metric_config.at("prefix").get<bool>())
            {
                // TODO check for overlapping prefixes
                // add . to end
                prefixes_.emplace_back(name + ".", metric_config);
            }
            else
            {
                const auto& [metric, inserted] = emplace(name, metric_config);
                (void)metric;
                if (!inserted)
                {
                    throw_exception("duplicated metric name in initial configuration: ", name);
                }
            }
        }
    }
}